

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::Model(Model *this,char *path)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *path_local;
  Model *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  std::vector<Texture,_std::allocator<Texture>_>::vector(&this->textures_loaded);
  std::vector<Mesh,_std::allocator<Mesh>_>::vector(&this->meshes);
  std::__cxx11::string::string((string *)&this->directory);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  load_model(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

Model::Model(const char* path){
    load_model(std::string(path));
}